

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::WordTagger(WordTagger *this,WordTagger *from)

{
  TagsCase TVar1;
  InternalMetadataWithArenaLite *this_00;
  string *psVar2;
  long lVar3;
  StringVector *this_01;
  StringVector *from_00;
  WordTagger *from_local;
  WordTagger *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__WordTagger_00575fd0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  TagsUnion::TagsUnion((TagsUnion *)&this->Tags_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->language_,psVar2);
  language_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->language_,psVar2,(from->language_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->tokensoutputfeaturename_,psVar2);
  tokensoutputfeaturename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokensoutputfeaturename_,psVar2,(from->tokensoutputfeaturename_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->tokentagsoutputfeaturename_,psVar2);
  tokentagsoutputfeaturename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokentagsoutputfeaturename_,psVar2,(from->tokentagsoutputfeaturename_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->tokenlocationsoutputfeaturename_,psVar2);
  tokenlocationsoutputfeaturename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlocationsoutputfeaturename_,psVar2,
               (from->tokenlocationsoutputfeaturename_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->tokenlengthsoutputfeaturename_,psVar2);
  tokenlengthsoutputfeaturename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlengthsoutputfeaturename_,psVar2,
               (from->tokenlengthsoutputfeaturename_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->modelparameterdata_,psVar2);
  modelparameterdata_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->modelparameterdata_,psVar2,(from->modelparameterdata_).ptr_);
  }
  this->revision_ = from->revision_;
  clear_has_Tags(this);
  TVar1 = Tags_case(from);
  if ((TVar1 != TAGS_NOT_SET) && (TVar1 == kStringTags)) {
    this_01 = mutable_stringtags(this);
    from_00 = stringtags(from);
    StringVector::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

WordTagger::WordTagger(const WordTagger& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  language_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.language().size() > 0) {
    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  tokensoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokensoutputfeaturename().size() > 0) {
    tokensoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokensoutputfeaturename_);
  }
  tokentagsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokentagsoutputfeaturename().size() > 0) {
    tokentagsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokentagsoutputfeaturename_);
  }
  tokenlocationsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokenlocationsoutputfeaturename().size() > 0) {
    tokenlocationsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlocationsoutputfeaturename_);
  }
  tokenlengthsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokenlengthsoutputfeaturename().size() > 0) {
    tokenlengthsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlengthsoutputfeaturename_);
  }
  modelparameterdata_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.modelparameterdata().size() > 0) {
    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  revision_ = from.revision_;
  clear_has_Tags();
  switch (from.Tags_case()) {
    case kStringTags: {
      mutable_stringtags()->::CoreML::Specification::StringVector::MergeFrom(from.stringtags());
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.WordTagger)
}